

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::FmaCase::compare(FmaCase *this,void **inputs,void **outputs)

{
  float fVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  Interval ref;
  Interval local_48;
  
  uVar2 = glu::getDataTypeScalarSize
                    ((((this->super_CommonFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  do {
    if (uVar5 == uVar4) {
LAB_012728f5:
      return (long)(int)uVar2 <= (long)uVar4;
    }
    fVar1 = *(float *)((long)*outputs + uVar4 * 4);
    fma((double)(ulong)*(uint *)((long)*inputs + uVar4 * 4),
        (double)(ulong)*(uint *)((long)inputs[1] + uVar4 * 4),
        (double)(ulong)*(uint *)((long)inputs[2] + uVar4 * 4));
    dVar6 = INFINITY;
    if (!NAN(fVar1)) {
      dVar6 = (double)fVar1;
    }
    dVar7 = -INFINITY;
    if (!NAN(fVar1)) {
      dVar7 = (double)fVar1;
    }
    if (((dVar6 < local_48.m_lo) || (local_48.m_hi < dVar7)) ||
       ((NAN(fVar1) && (local_48.m_hasNaN == false)))) {
      poVar3 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar4);
      poVar3 = std::operator<<(poVar3,"] = ");
      tcu::operator<<(poVar3,&local_48);
      goto LAB_012728f5;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float			a			= ((const float*)inputs[0])[compNdx];
			const float			b			= ((const float*)inputs[1])[compNdx];
			const float			c			= ((const float*)inputs[2])[compNdx];
			const float			res			= ((const float*)outputs[0])[compNdx];
			const tcu::Interval	ref			= fma(precision, a, b, c);

			if (!ref.contains(res))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << ref;
				return false;
			}
		}

		return true;
	}